

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalWrenchesEstimation.cpp
# Opt level: O0

void __thiscall
iDynTree::estimateExternalWrenchesBuffers::estimateExternalWrenchesBuffers
          (estimateExternalWrenchesBuffers *this,size_t nrOfSubModels,size_t nrOfLinks)

{
  size_t in_RDI;
  size_t nrOfSubModels_00;
  estimateExternalWrenchesBuffers *this_00;
  size_t nrOfLinks_00;
  
  nrOfLinks_00 = in_RDI;
  std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::vector
            ((vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_> *)0x544e8a);
  nrOfSubModels_00 = in_RDI + 0x18;
  std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::vector
            ((vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *)0x544e9d);
  this_00 = (estimateExternalWrenchesBuffers *)(in_RDI + 0x30);
  std::vector<iDynTree::VectorFixSize<6U>,_std::allocator<iDynTree::VectorFixSize<6U>_>_>::vector
            ((vector<iDynTree::VectorFixSize<6U>,_std::allocator<iDynTree::VectorFixSize<6U>_>_> *)
             0x544eb0);
  iDynTree::LinkWrenches::LinkWrenches((LinkWrenches *)(in_RDI + 0x48),0);
  iDynTree::LinkPositions::LinkPositions((LinkPositions *)(nrOfLinks_00 + 0x60),0);
  resize(this_00,nrOfSubModels_00,nrOfLinks_00);
  return;
}

Assistant:

estimateExternalWrenchesBuffers::estimateExternalWrenchesBuffers(const size_t nrOfSubModels, const size_t nrOfLinks)
{
    resize(nrOfSubModels,nrOfLinks);
}